

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MipsParser.cpp
# Opt level: O3

bool __thiscall
MipsParser::decodeCop2BranchCondition(MipsParser *this,string *text,size_t *pos,int *result)

{
  char cVar1;
  size_t stringPos;
  size_t sVar2;
  bool bVar3;
  
  stringPos = *pos;
  sVar2 = text->_M_string_length;
  if (stringPos + 3 == sVar2) {
    bVar3 = startsWith(text,"any",stringPos);
    if (bVar3) {
      *result = 4;
    }
    else {
      bVar3 = startsWith(text,"all",*pos);
      if (!bVar3) {
        return false;
      }
      *result = 5;
    }
    *pos = *pos + 3;
    return true;
  }
  if (stringPos + 1 != sVar2) {
    return false;
  }
  *pos = sVar2;
  cVar1 = (text->_M_dataplus)._M_p[stringPos];
  switch(cVar1) {
  case '0':
switchD_001688ac_caseD_30:
    *result = 0;
    break;
  case '1':
switchD_001688ac_caseD_31:
    *result = 1;
    break;
  case '2':
switchD_001688ac_caseD_32:
    *result = 2;
    break;
  case '3':
switchD_001688ac_caseD_33:
    *result = 3;
    break;
  case '4':
    *result = 4;
    break;
  case '5':
    *result = 5;
    break;
  default:
    switch(cVar1) {
    case 'w':
      goto switchD_001688ac_caseD_33;
    case 'x':
      goto switchD_001688ac_caseD_30;
    case 'y':
      goto switchD_001688ac_caseD_31;
    case 'z':
      goto switchD_001688ac_caseD_32;
    default:
      *pos = stringPos;
      return false;
    }
  }
  return true;
}

Assistant:

bool MipsParser::decodeCop2BranchCondition(const std::string& text, size_t& pos, int& result)
{
	if (pos+3 == text.size())
	{
		if (startsWith(text,"any",pos))
		{
			result = 4;
			pos += 3;
			return true;
		}
		if (startsWith(text,"all",pos))
		{
			result = 5;
			pos += 3;
			return true;
		}
	} else if (pos+1 == text.size())
	{
		switch (text[pos++])
		{
		case 'x':
		case '0':
			result = 0;
			return true;
		case 'y':
		case '1':
			result = 1;
			return true;
		case 'z':
		case '2':
			result = 2;
			return true;
		case 'w':
		case '3':
			result = 3;
			return true;
		case '4':
			result = 4;
			return true;
		case '5':
			result = 5;
			return true;
		}

		// didn't match it
		pos--;
	}

	return false;
}